

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

Token * __thiscall llbuild::ninja::Lexer::lexVariableString(Lexer *this,Token *result)

{
  char cVar1;
  char *pcVar2;
  
  while (pcVar2 = this->bufferPos, pcVar2 != (this->buffer).Data + (this->buffer).Length) {
    cVar1 = *pcVar2;
    if (cVar1 == '$') {
      getNextChar(this);
    }
    else if (((cVar1 == '\n') || (cVar1 == '\r')) || (cVar1 == -1)) break;
    getNextChar(this);
  }
  result->tokenKind = String;
  result->length = (int)pcVar2 - *(int *)&result->start;
  return result;
}

Assistant:

Token& Lexer::lexVariableString(Token& result) {
  // String tokens in variable assignments consume until the end of the line.
  while (true) {
    int c = peekNextChar();

    // If this is an escape character, skip the next character.
    if (c == '$') {
      getNextChar(); // Consume the actual '$'.
      getNextChar(); // Consume the next character.
      continue;
    }

    // Otherwise, continue only if this is not the EOL or EOF.
    if (c == '\n' || c == -1 || c == '\r')
      break;

    getNextChar();
  }

  return setTokenKind(result, Token::Kind::String);
}